

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O0

void cali_begin_byname(char *attr_name)

{
  Variant local_80 [2];
  allocator<char> local_59;
  string local_58;
  Attribute local_38;
  Attribute attr;
  Caliper c;
  char *attr_name_local;
  
  cali::Caliper::Caliper((Caliper *)&attr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,attr_name,&local_59);
  local_38 = cali::Caliper::create_attribute
                       ((Caliper *)&attr,&local_58,CALI_TYPE_BOOL,0,0,(Attribute *)0x0,
                        (Variant *)0x0);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  cali::Variant::Variant(local_80,true);
  cali::Caliper::begin((Caliper *)&attr,&local_38,local_80);
  cali::Caliper::~Caliper((Caliper *)&attr);
  return;
}

Assistant:

void cali_begin_byname(const char* attr_name)
{
    Caliper   c;
    Attribute attr = c.create_attribute(attr_name, CALI_TYPE_BOOL, CALI_ATTR_DEFAULT);

    c.begin(attr, Variant(true));
}